

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::RunListFile
          (cmMakefile *this,cmListFile *listFile,string *filenametoread,DeferCommands *defer)

{
  bool bVar1;
  int code;
  string *psVar2;
  pointer pbVar3;
  const_reference lff;
  cmake *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variables;
  DeferCommand *pDVar4;
  reference pvVar5;
  ulong uVar6;
  allocator<char> local_451;
  string local_450;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  string local_3e0;
  string_view local_3c0;
  allocator<char> local_3a9;
  string local_3a8;
  string_view local_388;
  allocator<char> local_371;
  string local_370;
  string_view local_350;
  allocator<char> local_339;
  string local_338;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  undefined1 local_2f0 [8];
  cmExecutionStatus status_1;
  DeferCallScope callScope;
  string id;
  DeferCommand *d;
  size_t i_1;
  DeferScope scope;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  undefined1 local_230 [8];
  cmExecutionStatus status;
  size_t i;
  size_t numberFunctions;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  string local_158;
  string_view local_138;
  allocator<char> local_121;
  string local_120;
  string_view local_100;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string currentFile;
  allocator<char> local_69;
  string local_68;
  string local_48 [8];
  string currentParentFile;
  DeferCommands *defer_local;
  string *filenametoread_local;
  cmListFile *listFile_local;
  cmMakefile *this_local;
  
  currentParentFile.field_2._8_8_ = defer;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,filenametoread);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_PARENT_LIST_FILE",&local_69);
  psVar2 = GetSafeDefinition(this,&local_68);
  std::__cxx11::string::string(local_48,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CMAKE_CURRENT_LIST_FILE",&local_c1);
  psVar2 = GetSafeDefinition(this,&local_c0);
  std::__cxx11::string::string((string *)local_a0,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"CMAKE_CURRENT_LIST_FILE",&local_e9);
  local_100 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)filenametoread);
  AddDefinition(this,&local_e8,local_100);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"CMAKE_CURRENT_LIST_DIR",&local_121);
  cmsys::SystemTools::GetFilenamePath(&local_158,filenametoread);
  local_138 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_158);
  AddDefinition(this,&local_120,local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"CMAKE_PARENT_LIST_FILE",&local_179);
  MarkVariableAsUsed(this,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"CMAKE_CURRENT_LIST_FILE",&local_1a1);
  MarkVariableAsUsed(this,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"CMAKE_CURRENT_LIST_DIR",
             (allocator<char> *)((long)&numberFunctions + 7));
  MarkVariableAsUsed(this,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&numberFunctions + 7));
  pbVar3 = (pointer)std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::size
                              (&listFile->Functions);
  for (status.Variables.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      status.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage < pbVar3;
      status.Variables.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)&(status.Variables.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0x1) {
    cmExecutionStatus::cmExecutionStatus((cmExecutionStatus *)local_230,this);
    lff = std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator[]
                    (&listFile->Functions,
                     (size_type)
                     status.Variables.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_258);
    ExecuteCommand(this,lff,(cmExecutionStatus *)local_230,&local_258);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_258);
    bVar1 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar1) {
      scope.Makefile._4_4_ = 2;
    }
    else {
      bVar1 = cmExecutionStatus::HasExitCode((cmExecutionStatus *)local_230);
      if (bVar1) {
        this_00 = GetCMakeInstance(this);
        code = cmExecutionStatus::GetExitCode((cmExecutionStatus *)local_230);
        cmake::SetScriptModeExitCode(this_00,code);
        scope.Makefile._4_4_ = 2;
      }
      else {
        bVar1 = cmExecutionStatus::GetReturnInvoked((cmExecutionStatus *)local_230);
        if (bVar1) {
          variables = cmExecutionStatus::GetReturnVariables_abi_cxx11_
                                ((cmExecutionStatus *)local_230);
          RaiseScope(this,variables);
          scope.Makefile._4_4_ = 2;
        }
        else {
          scope.Makefile._4_4_ = 0;
        }
      }
    }
    cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_230);
    if (scope.Makefile._4_4_ != 0) break;
  }
  if (currentParentFile.field_2._8_8_ != 0) {
    DeferScope::DeferScope((DeferScope *)&i_1,this,filenametoread);
    d = (DeferCommand *)0x0;
    while( true ) {
      pDVar4 = (DeferCommand *)
               std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>::
               size((vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_> *)
                    currentParentFile.field_2._8_8_);
      if (pDVar4 <= d) break;
      pvVar5 = std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>::
               operator[]((vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>
                           *)currentParentFile.field_2._8_8_,(size_type)d);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::__cxx11::string::string((string *)&callScope,(string *)pvVar5);
        DeferCallScope::DeferCallScope
                  ((DeferCallScope *)
                   &status_1.Variables.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,this,&pvVar5->FilePath);
        cmExecutionStatus::cmExecutionStatus((cmExecutionStatus *)local_2f0,this);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_318,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&callScope);
        ExecuteCommand(this,&pvVar5->Command,(cmExecutionStatus *)local_2f0,&local_318);
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        ~optional(&local_318);
        bVar1 = cmSystemTools::GetFatalErrorOccurred();
        if (bVar1) {
          scope.Makefile._4_4_ = 5;
        }
        else {
          scope.Makefile._4_4_ = 0;
        }
        cmExecutionStatus::~cmExecutionStatus((cmExecutionStatus *)local_2f0);
        DeferCallScope::~DeferCallScope
                  ((DeferCallScope *)
                   &status_1.Variables.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)&callScope);
        if (scope.Makefile._4_4_ != 0) break;
      }
      d = (DeferCommand *)&(d->Id).field_0x1;
    }
    DeferScope::~DeferScope((DeferScope *)&i_1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"CMAKE_PARENT_LIST_FILE",&local_339);
  local_350 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
  AddDefinition(this,&local_338,local_350);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator(&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"CMAKE_CURRENT_LIST_FILE",&local_371);
  local_388 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a0);
  AddDefinition(this,&local_370,local_388);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"CMAKE_CURRENT_LIST_DIR",&local_3a9);
  cmsys::SystemTools::GetFilenamePath(&local_3e0,(string *)local_a0);
  local_3c0 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3e0);
  AddDefinition(this,&local_3a8,local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"CMAKE_PARENT_LIST_FILE",&local_401);
  MarkVariableAsUsed(this,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator(&local_401);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"CMAKE_CURRENT_LIST_FILE",&local_429);
  MarkVariableAsUsed(this,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"CMAKE_CURRENT_LIST_DIR",&local_451);
  MarkVariableAsUsed(this,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator(&local_451);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void cmMakefile::RunListFile(cmListFile const& listFile,
                             std::string const& filenametoread,
                             DeferCommands* defer)
{
  // add this list file to the list of dependencies
  this->ListFiles.push_back(filenametoread);

  std::string currentParentFile =
    this->GetSafeDefinition("CMAKE_PARENT_LIST_FILE");
  std::string currentFile = this->GetSafeDefinition("CMAKE_CURRENT_LIST_FILE");

  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", filenametoread);
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(filenametoread));

  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");

  // Run the parsed commands.
  const size_t numberFunctions = listFile.Functions.size();
  for (size_t i = 0; i < numberFunctions; ++i) {
    cmExecutionStatus status(*this);
    this->ExecuteCommand(listFile.Functions[i], status);
    if (cmSystemTools::GetFatalErrorOccurred()) {
      break;
    }
    if (status.HasExitCode()) {
      // cmake_language EXIT was requested, early break.
      this->GetCMakeInstance()->SetScriptModeExitCode(status.GetExitCode());
      break;
    }
    if (status.GetReturnInvoked()) {
      this->RaiseScope(status.GetReturnVariables());
      // Exit early due to return command.
      break;
    }
  }

  // Run any deferred commands.
  if (defer) {
    // Add a backtrace level indicating calls are deferred.
    DeferScope scope(this, filenametoread);

    // Iterate by index in case one deferred call schedules another.
    // NOLINTNEXTLINE(modernize-loop-convert)
    for (size_t i = 0; i < defer->Commands.size(); ++i) {
      DeferCommand& d = defer->Commands[i];
      if (d.Id.empty()) {
        // Canceled.
        continue;
      }
      // Mark as executed.
      std::string id = std::move(d.Id);

      // The deferred call may have come from another file.
      DeferCallScope callScope(this, d.FilePath);

      cmExecutionStatus status(*this);
      this->ExecuteCommand(d.Command, status, std::move(id));
      if (cmSystemTools::GetFatalErrorOccurred()) {
        break;
      }
    }
  }

  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentParentFile);
  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", currentFile);
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(currentFile));
  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");
}